

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O2

void __thiscall
ring_buffer_base<cubeb_log_message>::ring_buffer_base
          (ring_buffer_base<cubeb_log_message> *this,int capacity)

{
  pointer __p;
  ulong uVar1;
  size_t __n;
  
  this->capacity_ = capacity + 1;
  (this->data_)._M_t.
  super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>._M_t.
  super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>.
  super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl = (cubeb_log_message *)0x0;
  __n = (long)(capacity + 1) << 8;
  uVar1 = 0xffffffffffffffff;
  if (-2 < capacity) {
    uVar1 = __n;
  }
  __p = (pointer)operator_new__(uVar1);
  if (capacity != -1) {
    memset(__p,0,__n);
  }
  std::__uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>::reset
            ((__uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_> *)
             &this->data_,__p);
  LOCK();
  (this->write_index_).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->read_index_).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

ring_buffer_base(int capacity)
      /* One more element to distinguish from empty and full buffer. */
      : capacity_(capacity + 1)
  {
    assert(storage_capacity() < std::numeric_limits<int>::max() / 2 &&
           "buffer too large for the type of index used.");
    assert(capacity_ > 0);

    data_.reset(new T[storage_capacity()]);
    /* If this queue is using atomics, initializing those members as the last
     * action in the constructor acts as a full barrier, and allow capacity() to
     * be thread-safe. */
    write_index_ = 0;
    read_index_ = 0;
  }